

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

bool __thiscall
JsUtil::
BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<int>
          (BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int *key,int *i,int *last,uint *targetBucket)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  uint uVar4;
  int *piVar5;
  
  piVar2 = this->buckets;
  if (piVar2 == (Type)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = GetBucket(this,*key * 2 + 1);
    *targetBucket = uVar4;
    *last = -1;
    pSVar3 = this->entries;
    piVar5 = piVar2 + *targetBucket;
    uVar4 = 0;
    while( true ) {
      iVar1 = *piVar5;
      *i = iVar1;
      if ((long)iVar1 < 0) break;
      if (pSVar3[iVar1].
          super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
          super_KeyValueEntry<int,_bool>.
          super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
          .super_KeyValueEntryDataLayout2<int,_bool>.key == *key) {
        if (this->stats == (DictionaryStats *)0x0) {
          return true;
        }
        DictionaryStats::Lookup(this->stats,uVar4);
        return true;
      }
      uVar4 = uVar4 + 1;
      *last = iVar1;
      piVar5 = &pSVar3[*i].
                super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
                super_KeyValueEntry<int,_bool>.
                super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                .super_KeyValueEntryDataLayout2<int,_bool>.next;
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,uVar4);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }